

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

kp_error_t list_dir_r(char ***safes,int *nsafes,char *root)

{
  int iVar1;
  bool bVar2;
  kp_error_t kVar3;
  DIR *__dirp;
  dirent *pdVar4;
  ulong uVar5;
  int *piVar6;
  char **ppcVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  char path [4096];
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dirp = opendir(root);
  if (__dirp == (DIR *)0x0) {
    kVar3 = 5;
    kp_warn(5,"cannot open dir %s",root);
  }
  else {
    pdVar4 = readdir(__dirp);
    if (pdVar4 == (dirent *)0x0) {
      kVar3 = 0;
    }
    else {
      kVar3 = 0;
      do {
        if ((pdVar4->d_name[0] == '.') || ((pdVar4->d_type != '\b' && (pdVar4->d_type != '\x04'))))
        goto LAB_00106415;
        uVar5 = strlcpy(local_1038,root,0x1000);
        if ((0xfff < uVar5) ||
           ((uVar5 = strlcat(local_1038,"/",0x1000), 0xfff < uVar5 ||
            (uVar5 = strlcat(local_1038,pdVar4->d_name,0x1000), 0xfff < uVar5)))) goto LAB_0010637e;
        if (pdVar4->d_type == '\x04') {
          kVar3 = list_dir_r(safes,nsafes,local_1038);
LAB_00106415:
          bVar2 = false;
        }
        else {
          if (pdVar4->d_type != '\b') goto LAB_00106415;
          ppcVar7 = (char **)reallocarray(*safes,(long)*nsafes + 1,8);
          *safes = ppcVar7;
          if (ppcVar7 != (char **)0x0) {
            pcVar8 = strndup(local_1038,0x1000);
            iVar1 = *nsafes;
            ppcVar7[iVar1] = pcVar8;
            if ((*safes)[iVar1] != (char *)0x0) {
              *nsafes = iVar1 + 1;
              goto LAB_00106415;
            }
          }
LAB_0010637e:
          piVar6 = __errno_location();
          *piVar6 = 0xc;
          kVar3 = 5;
          kp_warn(5,"memory error");
          bVar2 = true;
        }
      } while ((!bVar2) && (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0));
    }
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return kVar3;
}

Assistant:

static kp_error_t
list_dir_r(char ***safes, int *nsafes, char *root)
{
	kp_error_t ret = KP_SUCCESS;
	DIR *dirp;
	struct dirent *dirent;

	if ((dirp = opendir(root)) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot open dir %s", root);
		return ret;
	}

	while ((dirent = readdir(dirp)) != NULL) {
		char path[PATH_MAX];
		if (dirent->d_name[0] == '.'
				|| (dirent->d_type != DT_REG
				&& dirent->d_type != DT_DIR)) {
			continue;
		}

		if (strlcpy(path, root, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, "/", PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, dirent->d_name, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		switch (dirent->d_type) {
		case DT_REG:
			if ((*safes = reallocarray(*safes, *nsafes + 1, sizeof(char *)))
					== NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*safes)[*nsafes] = strndup(path, PATH_MAX);
			if ((*safes)[*nsafes] == NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*nsafes)++;
			break;
		case DT_DIR:
			ret = list_dir_r(safes, nsafes, path);
		}
	}

out:
	closedir(dirp);

	return ret;
}